

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArcSineExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::ArcSineExpression::derivative(ArcSineExpression *this,VariableExpressionPtr *variable)

{
  element_type *peVar1;
  shared_ptr<Kandinsky::BaseExpression> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Expression *in_RDI;
  BaseExpressionPtr BVar2;
  Expression *in_stack_00000010;
  int *in_stack_00000018;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_00000040;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_00000048;
  Expression *arg;
  Expression *in_stack_ffffffffffffff78;
  undefined1 local_40 [32];
  SquareRootExpression *in_stack_ffffffffffffffe0;
  
  arg = in_RDI;
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x125f41);
  (*peVar1->_vptr_BaseExpression[1])(local_40,peVar1,in_RDX);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_00000048,in_stack_00000040);
  operator-<int,_Kandinsky::Expression,_nullptr>(in_stack_00000018,in_stack_00000010);
  sqrt<Kandinsky::Expression,_nullptr>(in_stack_ffffffffffffff78);
  operator/<std::shared_ptr<Kandinsky::BaseExpression>,_Kandinsky::SquareRootExpression,_nullptr>
            (in_RDX,in_stack_ffffffffffffffe0);
  BaseExpression::makePtr<Kandinsky::Expression>(arg);
  Expression::~Expression((Expression *)0x125fd6);
  SquareRootExpression::~SquareRootExpression((SquareRootExpression *)0x125fe0);
  Expression::~Expression((Expression *)0x125fea);
  Expression::~Expression((Expression *)0x125ff4);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x125ffe);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr ArcSineExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(m_arg->derivative(variable) / sqrt(1 - m_arg * m_arg));
    }